

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_crecv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  nn_req *in_RDI;
  nn_req *req;
  nn_req *dst;
  int local_4;
  
  if (in_RDI == (nn_req *)0x0) {
    in_RDI = (nn_req *)0x0;
  }
  dst = in_RDI;
  iVar1 = nn_req_inprogress(in_RDI);
  if (iVar1 == 0) {
    local_4 = -0x9523dfe;
  }
  else if (dst->state == 8) {
    nn_msg_mv((nn_msg *)dst,(nn_msg *)in_RDI);
    nn_msg_init((nn_msg *)dst,(size_t)in_RDI);
    nn_fsm_action((nn_fsm *)dst,(int)((ulong)in_RDI >> 0x20));
    local_4 = 0;
  }
  else {
    local_4 = -0xb;
  }
  return local_4;
}

Assistant:

int nn_req_crecv (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  No request was sent. Waiting for a reply doesn't make sense. */
    if (nn_slow (!nn_req_inprogress (req)))
        return -EFSM;

    /*  If reply was not yet recieved, wait further. */
    if (nn_slow (req->state != NN_REQ_STATE_DONE))
        return -EAGAIN;

    /*  If the reply was already received, just pass it to the caller. */
    nn_msg_mv (msg, &req->task.reply);
    nn_msg_init (&req->task.reply, 0);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_RECEIVED);

    return 0;
}